

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_MockFailureTest_MockUnexpectedObjectFailure_Test::testBody
          (TEST_MockFailureTest_MockUnexpectedObjectFailure_Test *this)

{
  size_t *this_00;
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  undefined1 local_e8 [56];
  MockUnexpectedObjectFailure failure;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockFailureTest_MockUnexpectedObjectFailure_Test *local_10;
  TEST_MockFailureTest_MockUnexpectedObjectFailure_Test *this_local;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  local_10 = this;
  SimpleString::SimpleString(&local_20,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_20);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x120))
            ((long *)CONCAT44(extraout_var,iVar2),2);
  SimpleString::~SimpleString(&local_20);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString(local_40,"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,local_40);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x120))
            ((long *)CONCAT44(extraout_var_00,iVar2),3);
  SimpleString::~SimpleString(local_40);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar1,1);
  (*(((this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3a])();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  this_00 = &failure.super_MockFailure.super_TestFailure.message_.bufferSize_;
  SimpleString::SimpleString((SimpleString *)this_00,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,this_00);
  SimpleString::~SimpleString
            ((SimpleString *)&failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  TEST_GROUP_CppUTestGroupMockFailureTest::addThreeCallsToList
            (&this->super_TEST_GROUP_CppUTestGroupMockFailureTest);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)(local_e8 + 0x20),"foo");
  MockUnexpectedObjectFailure::MockUnexpectedObjectFailure
            ((MockUnexpectedObjectFailure *)(local_e8 + 0x30),pUVar3,
             (SimpleString *)(local_e8 + 0x20),(void *)0x1,
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString((SimpleString *)(local_e8 + 0x20));
  pUVar3 = UtestShell::getCurrent();
  StringFromFormat(local_e8 + 0x10,
                   "MockFailure: Function called on an unexpected object: foo\n\tActual object for call has address: <%p>\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 1 time)"
                   ,1,2,3);
  pcVar4 = SimpleString::asCharString((SimpleString *)(local_e8 + 0x10));
  TestFailure::getMessage((TestFailure *)local_e8);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_e8);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,pcVar4,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0x12d,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_e8);
  SimpleString::~SimpleString((SimpleString *)(local_e8 + 0x10));
  MockUnexpectedObjectFailure::~MockUnexpectedObjectFailure
            ((MockUnexpectedObjectFailure *)(local_e8 + 0x30));
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedObjectFailure)
{
    call1->withName("foo").onObject((void*) 0x02);
    call2->withName("foo").onObject((void*) 0x03);
    call2->callWasMade(1);
    call2->wasPassedToObject();
    call3->withName("unrelated");
    addThreeCallsToList();

    MockUnexpectedObjectFailure failure(UtestShell::getCurrent(), "foo", (void*)0x1, *list);
    STRCMP_EQUAL(StringFromFormat (
                 "MockFailure: Function called on an unexpected object: foo\n"
                 "\tActual object for call has address: <%p>\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t(object address: %p)::foo -> no parameters (expected 1 call, called 1 time)",
                 (void*) 0x01, (void*) 0x02, (void*) 0x03).asCharString(), failure.getMessage().asCharString());
}